

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFusage.c
# Opt level: O2

uint64_t dissect_and_calculate(NF_list *nl)

{
  NF_link_map *pNVar1;
  char *pcVar2;
  undefined2 uVar3;
  long *plVar4;
  uint uVar5;
  int iVar6;
  int *__buf;
  long *__buf_00;
  char **ppcVar7;
  NF_link_map **ppNVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  NF_list *pNVar12;
  NF_link_map *pNVar13;
  uint64_t uVar14;
  long *plVar15;
  int i;
  int iVar16;
  int *piVar17;
  NF_list **ppNVar18;
  ulong uVar19;
  long lVar20;
  Elf64_Phdr *ph;
  uint uVar21;
  long *local_390;
  ulong local_380;
  filebuf fb;
  
  pNVar1 = nl->map;
  __buf_00 = (long *)pNVar1->l_phlen;
  __buf = (int *)malloc((size_t)__buf_00);
  pread(nl->fd,__buf,(size_t)__buf_00,pNVar1->l_phoff);
  piVar17 = __buf + (ulong)pNVar1->l_phnum * 0xe;
  for (; __buf < piVar17; __buf = __buf + 0xe) {
    if (*__buf == 2) {
      sVar10 = *(size_t *)(__buf + 10);
      __buf_00 = (long *)malloc(sVar10);
      pread(nl->fd,__buf_00,sVar10,*(__off_t *)(__buf + 2));
    }
    else if (*__buf == 1) {
      local_380 = *(long *)(__buf + 10) + *(long *)(__buf + 4);
    }
  }
  iVar16 = 0;
  iVar6 = 0;
  plVar15 = __buf_00;
  do {
    lVar20 = *plVar15;
    if (lVar20 == 1) {
      iVar16 = iVar16 + 1;
      plVar4 = local_390;
    }
    else {
      plVar4 = plVar15;
      if (lVar20 != 5) {
        if (lVar20 == 0x1d) {
          iVar6 = iVar6 + 1;
          plVar4 = local_390;
        }
        else {
          plVar4 = local_390;
          if (lVar20 == 0) break;
        }
      }
    }
    local_390 = plVar4;
    plVar15 = plVar15 + 2;
  } while( true );
  ppcVar7 = (char **)malloc((long)iVar6 << 3);
  pNVar1->l_runpath = ppcVar7;
  ppNVar8 = (NF_link_map **)calloc((long)(iVar16 + 2),8);
  pNVar1->l_search_list = ppNVar8;
  plVar15 = __buf_00 + 1;
  uVar21 = 0;
  do {
    if (plVar15[-1] == 0x1d) {
      pcVar9 = (char *)malloc(0x40);
      pread(nl->fd,pcVar9,0x40,*plVar15 + local_390[1]);
      pNVar1->l_runpath[(int)uVar21] = pcVar9;
      uVar21 = uVar21 + 1;
    }
    else if (plVar15[-1] == 0) break;
    plVar15 = plVar15 + 2;
  } while( true );
  uVar5 = 0;
  if ((int)uVar21 < 1) {
    uVar21 = 0;
  }
LAB_0010352f:
  if (*__buf_00 == 1) {
    lVar20 = __buf_00[1];
    pcVar9 = (char *)malloc(0x80);
    pread(nl->fd,pcVar9,0x80,lVar20 + local_390[1]);
    ppNVar18 = &head;
    do {
      pNVar12 = *ppNVar18;
      if (pNVar12 == (NF_list *)0x0) {
        iVar6 = open(pcVar9,0);
        if (iVar6 != -1) goto LAB_001036bc;
        uVar19 = 0;
        goto LAB_001035d2;
      }
      pNVar13 = pNVar12->map;
      iVar6 = strcmp(pcVar9,pNVar13->l_name);
      ppNVar18 = &pNVar12->next;
    } while (iVar6 != 0);
    *nl->map->l_search_list = pNVar13;
    goto LAB_00103753;
  }
  if (*__buf_00 == 0) {
    pNVar1->l_search_list[uVar5] = pNVar1;
    uVar14 = (local_380 & 0xfffffffffffff000) + 0x1000;
    nl->len = uVar14;
    return uVar14;
  }
  goto LAB_00103758;
  while( true ) {
    pcVar2 = pNVar1->l_runpath[uVar19];
    sVar10 = strlen(pcVar2);
    memcpy(&fb,pcVar2,sVar10);
    fb.buf[sVar10 - 8] = '/';
    sVar11 = strlen(pcVar9);
    memcpy(fb.buf + (sVar10 - 7),pcVar9,sVar11 + 1);
    iVar6 = open((char *)&fb,0);
    uVar19 = uVar19 + 1;
    if (iVar6 != -1) break;
LAB_001035d2:
    if (uVar21 == uVar19) {
      lVar20 = 0;
      goto LAB_00103646;
    }
  }
  goto LAB_001036bc;
  while( true ) {
    pcVar2 = *(char **)((long)sys_path + lVar20);
    sVar10 = strlen(pcVar2);
    memcpy(&fb,pcVar2,sVar10);
    sVar11 = strlen(pcVar9);
    memcpy(fb.buf + (sVar10 - 8),pcVar9,sVar11 + 1);
    iVar6 = open((char *)&fb,0);
    lVar20 = lVar20 + 8;
    if (iVar6 != -1) break;
LAB_00103646:
    if (lVar20 == 0x10) {
      printf("In mapping %s as a dependency: file not found\n",pcVar9);
      iVar6 = -1;
      break;
    }
  }
LAB_001036bc:
  pNVar12 = (NF_list *)calloc(0x20,1);
  tail->next = pNVar12;
  pNVar12->next = (NF_list *)0x0;
  fb.len = 0;
  tail = pNVar12;
  read(iVar6,fb.buf,0x340);
  uVar3 = fb.buf._56_2_;
  uVar19 = (ulong)(ushort)fb.buf._56_2_;
  pNVar13 = (NF_link_map *)calloc(0x298,1);
  pNVar12->map = pNVar13;
  pNVar12->fd = iVar6;
  pcVar9 = strdup(pcVar9);
  pNVar13->l_name = pcVar9;
  pNVar13->l_phnum = uVar3;
  pNVar13->l_phlen = uVar19 * 0x38;
  pNVar13->l_phoff = fb.buf._32_8_;
  *pNVar1->l_search_list = pNVar13;
LAB_00103753:
  uVar5 = 1;
LAB_00103758:
  __buf_00 = __buf_00 + 2;
  goto LAB_0010352f;
}

Assistant:

uint64_t dissect_and_calculate(struct NF_list *nl)
{
    /* this function examine ``nl`` on the list, and put its dependencies on the list */
    //fb.buf is used as a pointer to ELF header, later we will do this again in building up the link_map
    struct NF_link_map *l = nl->map;
    Elf64_Phdr *phdr = malloc(l->l_phlen);
    pread(nl->fd, (void *)phdr, l->l_phlen, l->l_phoff);
    uint16_t phnum = l->l_phnum;

    Elf64_Dyn *ld;
    Elf64_Addr mapstart = -1, mapend;

    /* now dealing with the program headers, from which we need to 
       access the PT_LOAD for memory it takes up, and 
       PT_DYNAMIC for the contents of .dynamic */
    for (Elf64_Phdr *ph = phdr; ph < &phdr[phnum]; ++ph)
    {
        if (ph->p_type == PT_LOAD)
        {
            if (mapstart < 0)
                mapstart = ALIGN_DOWN(ph->p_vaddr, 4096);
            mapend = ph->p_vaddr + ph->p_memsz;
        }
        else if (ph->p_type == PT_DYNAMIC)
        {
            ld = malloc(ph->p_memsz);
            /* though it is not the same time, but it is the same fd... */
            pread(nl->fd, (void *)ld, ph->p_memsz, ph->p_offset); //note that offset and paddr are not the same
        }
    }

    Elf64_Dyn *str, *dyn = ld, *curr = ld;
    int nrunp = 0, nneeded = 0;

    while (curr->d_tag != DT_NULL)
    {
        switch (curr->d_tag)
        {
        case DT_STRTAB:
            str = curr;
            break;
        case DT_NEEDED:
            nneeded++;
            break;
        case DT_RUNPATH:
            nrunp++;
            break;
        }
        curr++;
    }
    l->l_runpath = (const char **)malloc(nrunp * sizeof(char *));
    l->l_search_list = (struct NF_link_map **)calloc(nneeded + 2, sizeof(struct NF_link_map *));
    int runpcnt = 0;
    int neededcnt = 0; //again, this is for filling the search list

    while (dyn->d_tag != DT_NULL)
    {
        if (dyn->d_tag == DT_RUNPATH)
        {
            char *tmp_name = malloc(64);
            pread(nl->fd, tmp_name, 64, str->d_un.d_ptr + dyn->d_un.d_val);
            l->l_runpath[runpcnt] = tmp_name;
            runpcnt++;
        }
        dyn++;
    }

    dyn = ld;
    while (dyn->d_tag != DT_NULL)
    {
        if (dyn->d_tag == DT_NEEDED)
        {
            neededcnt = 0; //neededcnt is DT_NEEDED-wise
            Elf64_Addr offset = dyn->d_un.d_val;
            char *filename = malloc(128);                           //store the filename for each dependency
            pread(nl->fd, filename, 128, str->d_un.d_ptr + offset); //change from 64 to 128 because the prefix is long
            struct NF_list *tmp = head;
            int found = 0;
            while (tmp != NULL)
            {
                if (!strcmp(filename, tmp->map->l_name))
                {
                    found = 1;
                    nl->map->l_search_list[neededcnt++] = tmp->map;
                    break;
                }
                tmp = tmp->next;
            }
            if (!found)
            {
                int fd = open(filename, O_RDONLY);
                /* XXX problems here
                 * open will successfully deal with file under the current directory
                 * but dlopen won't until RUNPATH is set
                 */
                if (fd == -1)
                {
                    //XXX: THIS IS NOT REALLY USEABLE NOW, PLZ ADD RUNPATH SUPPORT
                    //only lib1.so -> lib2.so -> lib3.so will work now ... and no libc func can be used

                    char buf[128];
                    for (int i = 0; i < runpcnt; i++)
                    {
                        char *ptr = mempcpy(buf, l->l_runpath[i], strlen(l->l_runpath[i]));
                        *ptr = '/'; //add a "/" to make it a path
                        ptr++;
                        memcpy(ptr, filename, strlen(filename) + 1); //+1 to copy \0. memcpy only copy num bytes
                        if ((fd = open(buf, O_RDONLY)) != -1)
                            break;
                    }
                    //nothing found in runpath, now try system path
                    if (fd == -1)
                    {
                        for (int i = 0; i < 2; i++)
                        {
                            char *ptr = mempcpy(buf, sys_path[i], strlen(sys_path[i]));
                            memcpy(ptr, filename, strlen(filename) + 1);
                            if ((fd = open(buf, O_RDONLY)) != -1)
                                break;
                        }
                        if (fd == -1)
                            printf("In mapping %s as a dependency: file not found\n", filename);
                    }
                }
                struct NF_list *tmp = calloc(sizeof(struct NF_list), 1);
                //reset the pointers to fit a new element
                tail->next = tmp;
                tmp->next = NULL;
                tail = tmp; //set tail to be the last unique element
                /* filling the info all over again */
                struct filebuf fb;
                fb.len = 0;
                size_t retlen = read(fd, fb.buf, sizeof(fb.buf) - fb.len);
                Elf64_Ehdr *ehdr = (Elf64_Ehdr *)fb.buf;
                Elf64_Addr maplength = ehdr->e_phnum * sizeof(Elf64_Phdr);

                tmp->map = calloc(sizeof(struct NF_link_map), 1);
                tmp->fd = fd;
                char *real_name = strdup(filename); //don't forget to free it when destroying a link_map!
                tmp->map->l_name = real_name;
                tmp->map->l_phnum = ehdr->e_phnum;
                tmp->map->l_phlen = maplength;
                tmp->map->l_phoff = ehdr->e_phoff;
                l->l_search_list[neededcnt++] = tmp->map;
            }
        }
        dyn++;
    }
    l->l_search_list[neededcnt] = l; //quick fix for global variables to relocate

    nl->len = ALIGN_UP(mapend - mapstart, 4096); //use this to get the exact location for next so if we want it compact
    return ALIGN_UP(mapend - mapstart, 4096);
}